

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_test.cc
# Opt level: O2

string * __thiscall
leveldb::Harness::ToString
          (string *__return_storage_ptr__,Harness *this,KVMap *data,const_iterator *it)

{
  Comparator *pCVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  pCVar1 = (data->_M_t)._M_impl.
           super__Rb_tree_key_compare<leveldb::(anonymous_namespace)::STLLessThan>._M_key_compare.
           cmp;
  if (pCVar1 == (Comparator *)&(this->options_).create_if_missing) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"END",(allocator *)&bStack_78);
  }
  else {
    std::operator+(&local_38,"\'",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(pCVar1 + 4)
                  );
    std::operator+(&local_58,&local_38,"->");
    std::operator+(&bStack_78,&local_58,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((data->_M_t)._M_impl.
                    super__Rb_tree_key_compare<leveldb::(anonymous_namespace)::STLLessThan>.
                    _M_key_compare.cmp + 8));
    std::operator+(__return_storage_ptr__,&bStack_78,"\'");
    std::__cxx11::string::~string((string *)&bStack_78);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ToString(const KVMap& data, const KVMap::const_iterator& it) {
    if (it == data.end()) {
      return "END";
    } else {
      return "'" + it->first + "->" + it->second + "'";
    }
  }